

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatclient.cpp
# Opt level: O2

void __thiscall ChatClient::login(ChatClient *this,QString *userName)

{
  int iVar1;
  QJsonObject message;
  QArrayDataPointer<char> local_c8;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  undefined1 local_58 [16];
  qsizetype local_48;
  QDataStream clientStream;
  QJsonValueRef local_20 [16];
  
  iVar1 = QAbstractSocket::state();
  if (iVar1 == 3) {
    QDataStream::QDataStream(&clientStream,(QIODevice *)this->m_clientSocket);
    QJsonObject::QJsonObject(&message);
    local_b0.d = (Data *)0x0;
    local_b0.ptr = L"login";
    local_b0.size = 5;
    local_98.d = (Data *)0x0;
    local_98.ptr = (char16_t *)0x0;
    local_98.size = 0;
    QJsonValue::QJsonValue((QJsonValue *)&local_c8,(QString *)&local_b0);
    local_58._0_8_ = (Data *)0x0;
    local_58._8_8_ = L"type";
    local_48 = 4;
    local_78.d = (Data *)0x0;
    local_78.ptr = (char16_t *)0x0;
    local_78.size = 0;
    local_20 = (QJsonValueRef  [16])QJsonObject::operator[]((QString *)&message);
    QJsonValueRef::operator=(local_20,(QJsonValue *)&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QJsonValue::~QJsonValue((QJsonValue *)&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    QJsonValue::QJsonValue((QJsonValue *)&local_c8,userName);
    local_b0.d = (Data *)0x0;
    local_b0.ptr = L"username";
    local_b0.size = 8;
    local_98.d = (Data *)0x0;
    local_98.ptr = (char16_t *)0x0;
    local_98.size = 0;
    local_58 = QJsonObject::operator[]((QString *)&message);
    QJsonValueRef::operator=((QJsonValueRef *)local_58,(QJsonValue *)&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    QJsonValue::~QJsonValue((QJsonValue *)&local_c8);
    QJsonDocument::QJsonDocument((QJsonDocument *)&local_b0,&message);
    QJsonDocument::toJson((JsonFormat)&local_c8);
    operator<<(&clientStream,(QByteArray *)&local_c8);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_c8);
    QJsonDocument::~QJsonDocument((QJsonDocument *)&local_b0);
    QJsonObject::~QJsonObject(&message);
    QDataStream::~QDataStream(&clientStream);
  }
  return;
}

Assistant:

void ChatClient::login(const QString &userName)
{
    if (m_clientSocket->state() == QAbstractSocket::ConnectedState) { // if the client is connected
        // create a QDataStream operating on the socket
        QDataStream clientStream(m_clientSocket);
        // set the version so that programs compiled with different versions of Qt can agree on how to serialise
        clientStream.setVersion(QDataStream::Qt_5_7);
        // Create the JSON we want to send
        QJsonObject message;
        message[QStringLiteral("type")] = QStringLiteral("login");
        message[QStringLiteral("username")] = userName;
        // send the JSON using QDataStream
        clientStream << QJsonDocument(message).toJson(QJsonDocument::Compact);
    }
}